

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GradeBook.cpp
# Opt level: O2

void __thiscall GradeBook::setCourseName(GradeBook *this,string *name)

{
  ostream *poVar1;
  string asStack_38 [32];
  
  if ((name->_M_string_length < 0x1a) &&
     (std::__cxx11::string::_M_assign((string *)this), name->_M_string_length < 0x1a)) {
    return;
  }
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)name);
  std::__cxx11::string::operator=((string *)this,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  poVar1 = std::operator<<((ostream *)&std::cout,"Name \"");
  poVar1 = std::operator<<(poVar1,(string *)name);
  std::operator<<(poVar1,"\" exceeds maximum length (25).\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Limiting courseName to first 25 characters.\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void GradeBook::setCourseName(const std::string &name) {
    if (name.length() <= 25) { courseName = name; }

    if (name.length() > 25) {
        courseName = name.substr(0, 25);

        std::cout << "Name \"" << name << "\" exceeds maximum length (25).\n";
        std::cout << "Limiting courseName to first 25 characters.\n"
                  << std::endl;
    }
}